

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void RunLegalizeExtracts(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  VmValue **ppVVar1;
  VmValue *value_00;
  Allocator *allocator;
  VariableData *container;
  bool bVar2;
  VmFunction *pVVar3;
  VmInstruction *pVVar4;
  VmValue *pVVar5;
  VmInstruction *replacement;
  TypeBase *pTVar6;
  VmConstant *pVVar7;
  TypeRef *structType;
  VmValue *pVVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  VmInstruction *original;
  VmBlock **ppVVar12;
  VmBlock *value_01;
  VmValue *pVVar13;
  bool bVar14;
  VmModule *module_00;
  SynBase *pSVar15;
  
  if ((value == (VmValue *)0x0) || (pVVar3 = (VmFunction *)value, value->typeID != 4)) {
    pVVar3 = (VmFunction *)0x0;
  }
  if (pVVar3 == (VmFunction *)0x0) {
    if ((value == (VmValue *)0x0) || (value->typeID != 3)) {
      value = (VmValue *)0x0;
    }
    if ((VmBlock *)value == (VmBlock *)0x0) {
      return;
    }
    ppVVar12 = &module->currentBlock;
    module->currentBlock = (VmBlock *)value;
    for (original = ((VmBlock *)value)->firstInstruction; original != (VmInstruction *)0x0;
        original = original->nextSibling) {
      if (original->cmd == VM_INST_EXTRACT) {
        uVar11 = (original->arguments).count;
        if ((uVar11 == 0) || (uVar11 == 1)) {
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,
                        "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                       );
        }
        ppVVar1 = (original->arguments).data;
        pVVar8 = ppVVar1[1];
        if ((pVVar8 == (VmValue *)0x0) || (pVVar8->typeID != 1)) {
          pVVar8 = (VmValue *)0x0;
        }
        value_00 = *ppVVar1;
        if ((value_00 == (VmValue *)0x0) || (pVVar13 = value_00, value_00->typeID != 2)) {
          pVVar13 = (VmValue *)0x0;
        }
        if (((pVVar13 != (VmValue *)0x0) && (*(int *)&pVVar13[1]._vptr_VmValue == 0x49)) &&
           (pVVar13[1].type.type != VM_TYPE_VOID)) {
          uVar9 = 0;
          bVar14 = false;
          iVar10 = 0;
          do {
            replacement = *(VmInstruction **)(*(long *)&pVVar13[1].typeID + uVar9 * 8);
            if ((*(int *)&pVVar8[1]._vptr_VmValue == iVar10) &&
               ((replacement->super_VmValue).type.size == (original->super_VmValue).type.size)) {
              if ((replacement == (VmInstruction *)0x0) ||
                 (pVVar4 = replacement, (replacement->super_VmValue).typeID != 4)) {
                pVVar4 = (VmInstruction *)0x0;
              }
              if (pVVar4 != (VmInstruction *)0x0) {
                ((VmBlock *)value)->insertPoint = original;
                module_00 = (VmModule *)(original->super_VmValue).source;
                pVVar5 = anon_unknown.dwarf_13465d::CreateFunctionAddress
                                   (module,(SynBase *)module_00,*(FunctionData **)&pVVar4->cmd);
                replacement = anon_unknown.dwarf_13465d::CreateInstruction
                                        ((anon_unknown_dwarf_13465d *)module,module_00,
                                         (SynBase *)0x400000001,(VmType)(ZEXT816(0x4e) << 0x40),
                                         (VmInstructionType)pVVar5,(VmValue *)0x0,(VmValue *)0x0,
                                         (VmValue *)0x0,(VmValue *)0x0,(VmValue *)module_00);
                ((VmBlock *)value)->insertPoint = ((VmBlock *)value)->lastInstruction;
              }
              bVar2 = false;
              anon_unknown.dwarf_13465d::ReplaceValueUsersWith
                        (module,&original->super_VmValue,&replacement->super_VmValue,(uint *)0x0);
              bVar14 = (original->super_VmValue).users.count == 0;
            }
            else {
              iVar10 = iVar10 + (replacement->super_VmValue).type.size;
              bVar2 = true;
            }
          } while ((bVar2) && (uVar9 = uVar9 + 1, uVar9 < pVVar13[1].type.type));
          if (bVar14) goto LAB_001bee4a;
        }
        pSVar15 = (original->super_VmValue).source;
        pTVar6 = GetBaseType(ctx,value_00->type);
        pVVar7 = anon_unknown.dwarf_13465d::CreateAlloca(ctx,module,pSVar15,pTVar6,"construct",true)
        ;
        FinalizeAlloca(ctx,module,pVVar7->container);
        ((VmBlock *)value)->insertPoint = original;
        pSVar15 = (original->super_VmValue).source;
        pTVar6 = GetBaseType(ctx,value_00->type);
        anon_unknown.dwarf_13465d::CreateStore
                  (ctx,module,pSVar15,pTVar6,&pVVar7->super_VmValue,value_00,0);
        allocator = module->allocator;
        pSVar15 = (original->super_VmValue).source;
        iVar10 = *(int *)&pVVar8[1]._vptr_VmValue;
        container = pVVar7->container;
        pTVar6 = GetBaseType(ctx,(original->super_VmValue).type);
        structType = ExpressionContext::GetReferenceType(ctx,pTVar6);
        uVar11 = 1;
        pVVar7 = CreateConstantPointer
                           (allocator,pSVar15,iVar10,container,&structType->super_TypeBase,true);
        pSVar15 = (original->super_VmValue).source;
        pTVar6 = GetBaseType(ctx,(original->super_VmValue).type);
        pVVar8 = anon_unknown.dwarf_13465d::CreateLoad
                           (ctx,module,pSVar15,pTVar6,&pVVar7->super_VmValue,uVar11);
        anon_unknown.dwarf_13465d::ReplaceValueUsersWith
                  (module,&original->super_VmValue,pVVar8,(uint *)0x0);
        ((VmBlock *)value)->insertPoint = ((VmBlock *)value)->lastInstruction;
      }
LAB_001bee4a:
    }
  }
  else {
    ppVVar12 = (VmBlock **)&module->currentFunction;
    module->currentFunction = pVVar3;
    for (value_01 = pVVar3->firstBlock; value_01 != (VmBlock *)0x0; value_01 = value_01->nextSibling
        ) {
      RunLegalizeExtracts(ctx,module,&value_01->super_VmValue);
    }
  }
  *ppVVar12 = (VmBlock *)0x0;
  return;
}

Assistant:

void RunLegalizeExtracts(ExpressionContext &ctx, VmModule *module, VmValue* value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		module->currentFunction = function;

		for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
			RunLegalizeExtracts(ctx, module, curr);

		module->currentFunction = NULL;
	}
	else if(VmBlock *block = getType<VmBlock>(value))
	{
		module->currentBlock = block;

		for(VmInstruction *curr = block->firstInstruction; curr; curr = curr->nextSibling)
		{
			if(curr->cmd == VM_INST_EXTRACT)
			{
				VmValue *target = curr->arguments[0];
				VmConstant *offset = getType<VmConstant>(curr->arguments[1]);

				VmInstruction *targetAsInst = getType<VmInstruction>(target);

				if(targetAsInst && targetAsInst->cmd == VM_INST_CONSTRUCT)
				{
					bool replaced = false;

					int pos = 0;

					for(unsigned i = 0; i < targetAsInst->arguments.size(); i++)
					{
						VmValue *argument = targetAsInst->arguments[i];

						if(offset->iValue == pos && argument->type.size == curr->type.size)
						{
							if(VmFunction *function = getType<VmFunction>(argument))
							{
								block->insertPoint = curr;

								argument = CreateBitcast(module, curr->source, VmType::Int, CreateFunctionAddress(module, curr->source, function->function));

								block->insertPoint = block->lastInstruction;
							}

							ReplaceValueUsersWith(module, curr, argument, NULL);

							replaced = curr->users.empty();
							break;
						}

						pos += argument->type.size;
					}

					if(replaced)
						continue;
				}

				VmConstant *address = CreateAlloca(ctx, module, curr->source, GetBaseType(ctx, target->type), "construct", true);

				FinalizeAlloca(ctx, module, address->container);

				block->insertPoint = curr;

				CreateStore(ctx, module, curr->source, GetBaseType(ctx, target->type), address, target, 0);

				VmConstant *shiftAddress = CreateConstantPointer(module->allocator, curr->source, offset->iValue, address->container, ctx.GetReferenceType(GetBaseType(ctx, curr->type)), true);

				ReplaceValueUsersWith(module, curr, CreateLoad(ctx, module, curr->source, GetBaseType(ctx, curr->type), shiftAddress, 0), NULL);

				block->insertPoint = block->lastInstruction;
			}
		}

		module->currentBlock = NULL;
	}
}